

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O3

int Gia_ManAppendCi(Gia_Man_t *p)

{
  ulong uVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  uint *puVar5;
  uint uVar6;
  long lVar7;
  
  uVar6 = p->nObjs;
  if (uVar6 == p->nObjsAlloc) {
    uVar3 = uVar6 * 2;
    if (0x1fffffff < (int)(uVar6 * 2)) {
      uVar3 = 0x20000000;
    }
    if (uVar6 == 0x20000000) {
      puts("Hard limit on the number of nodes (2^29) is reached. Quitting...");
      exit(1);
    }
    if ((int)uVar3 <= (int)uVar6) {
      __assert_fail("p->nObjs < nObjNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x24c,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
    }
    if (p->fVerbose != 0) {
      printf("Extending GIA object storage: %d -> %d.\n",(ulong)uVar6,(ulong)uVar3);
      uVar6 = p->nObjsAlloc;
    }
    if ((int)uVar6 < 1) {
      __assert_fail("p->nObjsAlloc > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x24f,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
    }
    lVar7 = (long)(int)uVar3;
    if (p->pObjs == (Gia_Obj_t *)0x0) {
      pGVar4 = (Gia_Obj_t *)malloc(lVar7 * 0xc);
    }
    else {
      pGVar4 = (Gia_Obj_t *)realloc(p->pObjs,lVar7 * 0xc);
      uVar6 = p->nObjsAlloc;
    }
    p->pObjs = pGVar4;
    memset(pGVar4 + (int)uVar6,0,(long)(int)(uVar3 - uVar6) * 0xc);
    if (p->pMuxes != (uint *)0x0) {
      puVar5 = (uint *)realloc(p->pMuxes,lVar7 * 4);
      p->pMuxes = puVar5;
      memset(puVar5 + p->nObjsAlloc,0,(lVar7 - p->nObjsAlloc) * 4);
    }
    p->nObjsAlloc = uVar3;
    uVar6 = p->nObjs;
  }
  p->nObjs = uVar6 + 1;
  if ((int)uVar6 < 0) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar4 = p->pObjs + uVar6;
  uVar1 = *(ulong *)pGVar4;
  *(ulong *)pGVar4 = uVar1 | 0x9fffffff;
  *(ulong *)pGVar4 =
       uVar1 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
  pGVar2 = p->pObjs;
  if ((pGVar2 <= pGVar4) && (pGVar4 < pGVar2 + p->nObjs)) {
    Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar4 - (long)pGVar2) >> 2) * -0x55555555);
    pGVar2 = p->pObjs;
    if ((pGVar2 <= pGVar4) && (pGVar4 < pGVar2 + p->nObjs)) {
      return (int)((ulong)((long)pGVar4 - (long)pGVar2) >> 2) * 0x55555556;
    }
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline int Gia_ManAppendCi( Gia_Man_t * p )  
{ 
    Gia_Obj_t * pObj = Gia_ManAppendObj( p );
    pObj->fTerm = 1;
    pObj->iDiff0 = GIA_NONE;
    pObj->iDiff1 = Vec_IntSize( p->vCis );
    Vec_IntPush( p->vCis, Gia_ObjId(p, pObj) );
    return Gia_ObjId( p, pObj ) << 1;
}